

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestSpecParser::visitChar(TestSpecParser *this,char c)

{
  Mode MVar1;
  int iVar2;
  size_t sVar3;
  long *local_38 [2];
  long local_28 [2];
  
  if (this->m_mode == None) {
    if (c < '[') {
      if (c == ' ') {
        return;
      }
      if (c == '\"') {
        sVar3 = this->m_pos + 1;
        this->m_pos = sVar3;
        this->m_mode = QuotedName;
        goto LAB_0014c2da;
      }
LAB_0014c2b2:
      this->m_mode = Name;
      this->m_start = this->m_pos;
      goto LAB_0014c198;
    }
    if (c != '[') {
      if (c == '~') {
        this->m_exclusion = true;
        return;
      }
      goto LAB_0014c2b2;
    }
  }
  else {
LAB_0014c198:
    MVar1 = this->m_mode;
    if (MVar1 != Name) {
      if (c == '\"' && MVar1 == QuotedName) {
        addPattern<Catch::TestSpec::NamePattern>(this);
        return;
      }
      if (c != ']' || MVar1 != Tag) {
        return;
      }
      addPattern<Catch::TestSpec::TagPattern>(this);
      return;
    }
    if (c != '[') {
      if (c != ',') {
        return;
      }
      addPattern<Catch::TestSpec::NamePattern>(this);
      addFilter(this);
      return;
    }
    std::__cxx11::string::substr((ulong)local_38,(ulong)&this->m_arg);
    iVar2 = std::__cxx11::string::compare((char *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    if (iVar2 == 0) {
      this->m_exclusion = true;
    }
    else {
      addPattern<Catch::TestSpec::NamePattern>(this);
    }
  }
  sVar3 = this->m_pos + 1;
  this->m_pos = sVar3;
  this->m_mode = Tag;
LAB_0014c2da:
  this->m_start = sVar3;
  return;
}

Assistant:

void visitChar( char c ) {
            if( m_mode == None ) {
                switch( c ) {
                case ' ': return;
                case '~': m_exclusion = true; return;
                case '[': return startNewMode( Tag, ++m_pos );
                case '"': return startNewMode( QuotedName, ++m_pos );
                default: startNewMode( Name, m_pos ); break;
                }
            }
            if( m_mode == Name ) {
                if( c == ',' ) {
                    addPattern<TestSpec::NamePattern>();
                    addFilter();
                }
                else if( c == '[' ) {
                    if( subString() == "exclude:" )
                        m_exclusion = true;
                    else
                        addPattern<TestSpec::NamePattern>();
                    startNewMode( Tag, ++m_pos );
                }
            }
            else if( m_mode == QuotedName && c == '"' )
                addPattern<TestSpec::NamePattern>();
            else if( m_mode == Tag && c == ']' )
                addPattern<TestSpec::TagPattern>();
        }